

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O1

int SUNLinSol_SPGMRSetMaxRestarts(SUNLinearSolver S,int maxrs)

{
  if (S != (SUNLinearSolver)0x0) {
    if (maxrs < 1) {
      maxrs = 0;
    }
    *(int *)((long)S->content + 0xc) = maxrs;
    return 0;
  }
  return -0x321;
}

Assistant:

int SUNLinSol_SPGMRSetMaxRestarts(SUNLinearSolver S, int maxrs)
{
  /* Illegal maxrs implies use of default value */
  if (maxrs < 0)
    maxrs = SUNSPGMR_MAXRS_DEFAULT;

  /* Check for non-NULL SUNLinearSolver */
  if (S == NULL) return(SUNLS_MEM_NULL);

  /* Set max_restarts */
  SPGMR_CONTENT(S)->max_restarts = maxrs;
  return(SUNLS_SUCCESS);
}